

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_tests.cpp
# Opt level: O2

void __thiscall util_tests::message_verify::test_method(message_verify *this)

{
  iterator in_R8;
  iterator pvVar1;
  iterator in_R9;
  MessageVerificationResult *pMVar2;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  undefined4 local_f4;
  allocator<char> local_ef;
  allocator<char> local_ee;
  allocator<char> local_ed;
  MessageVerificationResult local_ec;
  char *local_e8;
  char *local_e0;
  undefined **local_d8;
  undefined1 local_d0;
  undefined1 *local_c8;
  char *local_c0;
  undefined1 *local_b8;
  undefined1 *local_b0;
  char *local_a8;
  char *local_a0;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_a0 = "";
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x66a;
  file.m_begin = (iterator)&local_a8;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_b8,msg);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_e0 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"invalid address",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"signature should be irrelevant",&local_ee);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"message too",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 0;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_e8,0x66a,1,2,pMVar2,
             "MessageVerify( \"invalid address\", \"signature should be irrelevant\", \"message too\")"
             ,&local_f4,"MessageVerificationResult::ERR_INVALID_ADDRESS");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x671;
  file_00.m_begin = (iterator)&local_108;
  msg_00.m_end = (iterator)pMVar2;
  msg_00.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_118,
             msg_00);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_120 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"signature should be irrelevant",&local_ee);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"message too",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 1;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_128,0x671,1,2,pMVar2,
             "MessageVerify( \"3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV\", \"signature should be irrelevant\", \"message too\")"
             ,&local_f4,"MessageVerificationResult::ERR_ADDRESS_NO_KEY");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x678;
  file_01.m_begin = (iterator)&local_138;
  msg_01.m_end = (iterator)pMVar2;
  msg_01.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_148,
             msg_01);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_150 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"invalid signature, not in base64 encoding",&local_ee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"message should be irrelevant",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 2;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_158,0x678,1,2,pMVar2,
             "MessageVerify( \"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm\", \"invalid signature, not in base64 encoding\", \"message should be irrelevant\")"
             ,&local_f4,"MessageVerificationResult::ERR_MALFORMED_SIGNATURE");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x67f;
  file_02.m_begin = (iterator)&local_168;
  msg_02.m_end = (iterator)pMVar2;
  msg_02.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_178,
             msg_02);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_180 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA="
             ,&local_ee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"message should be irrelevant",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 3;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_188,0x67f,1,2,pMVar2,
             "MessageVerify( \"1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm\", \"AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA=\", \"message should be irrelevant\")"
             ,&local_f4,"MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x686;
  file_03.m_begin = (iterator)&local_198;
  msg_03.m_end = (iterator)pMVar2;
  msg_03.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1a8,
             msg_03);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1b0 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,&local_ee);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"I never signed this",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 4;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_1b8,0x686,1,2,pMVar2,
             "MessageVerify( \"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs\", \"IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=\", \"I never signed this\")"
             ,&local_f4,"MessageVerificationResult::ERR_NOT_SIGNED");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x68d;
  file_04.m_begin = (iterator)&local_1c8;
  msg_04.m_end = (iterator)pMVar2;
  msg_04.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_1d8,
             msg_04);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1e0 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk="
             ,&local_ee);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Trust no one",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  pMVar2 = &local_ec;
  local_f4 = 5;
  pvVar1 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_1e8,0x68d,1,2,pMVar2,
             "MessageVerify( \"15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs\", \"IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=\", \"Trust no one\")"
             ,&local_f4,"MessageVerificationResult::OK");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x694;
  file_05.m_begin = (iterator)&local_1f8;
  msg_05.m_end = (iterator)pMVar2;
  msg_05.m_begin = pvVar1;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_208,
             msg_05);
  local_d0 = 0;
  local_d8 = &PTR__lazy_ostream_011480b0;
  local_c8 = boost::unit_test::lazy_ostream::inst;
  local_c0 = "";
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util_tests.cpp";
  local_210 = "";
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"11canuhp9X2NocwCq7xNrQYTmUgZAnLK3",&local_ed);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,
             "IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14="
             ,&local_ee);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_98,"Trust me",&local_ef);
  local_ec = MessageVerify(&local_58,&local_78,&local_98);
  local_f4 = 5;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,MessageVerificationResult,MessageVerificationResult>
            (&local_d8,&local_218,0x694,1,2,&local_ec,
             "MessageVerify( \"11canuhp9X2NocwCq7xNrQYTmUgZAnLK3\", \"IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14=\", \"Trust me\")"
             ,&local_f4,"MessageVerificationResult::OK");
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(message_verify)
{
    BOOST_CHECK_EQUAL(
        MessageVerify(
            "invalid address",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_INVALID_ADDRESS);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "3B5fQsEXEaV8v6U3ejYc8XaKXAkyQj2MjV",
            "signature should be irrelevant",
            "message too"),
        MessageVerificationResult::ERR_ADDRESS_NO_KEY);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "invalid signature, not in base64 encoding",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_MALFORMED_SIGNATURE);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "1KqbBpLy5FARmTPD4VZnDDpYjkUvkr82Pm",
            "AAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAAA=",
            "message should be irrelevant"),
        MessageVerificationResult::ERR_PUBKEY_NOT_RECOVERED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "I never signed this"),
        MessageVerificationResult::ERR_NOT_SIGNED);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "15CRxFdyRpGZLW9w8HnHvVduizdL5jKNbs",
            "IPojfrX2dfPnH26UegfbGQQLrdK844DlHq5157/P6h57WyuS/Qsl+h/WSVGDF4MUi4rWSswW38oimDYfNNUBUOk=",
            "Trust no one"),
        MessageVerificationResult::OK);

    BOOST_CHECK_EQUAL(
        MessageVerify(
            "11canuhp9X2NocwCq7xNrQYTmUgZAnLK3",
            "IIcaIENoYW5jZWxsb3Igb24gYnJpbmsgb2Ygc2Vjb25kIGJhaWxvdXQgZm9yIGJhbmtzIAaHRtbCeDZINyavx14=",
            "Trust me"),
        MessageVerificationResult::OK);
}